

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O1

bool tinyusdz::tydra::EvaluateShaderAttribute<std::array<unsigned_int,2ul>>
               (Stage *stage,Shader *shader,string *attr_name,array<unsigned_int,_2UL> *out_val,
               string *err,TimeCode timeCode)

{
  vtable_type *pvVar1;
  UsdPreviewSurface *pUVar2;
  array<unsigned_int,_2UL> *paVar3;
  long *plVar4;
  long *plVar5;
  Value outval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  storage_union local_58;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (out_val != (array<unsigned_int,_2UL> *)0x0) {
    local_48 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_58.dynamic = (void *)0x0;
    pUVar2 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&shader->value,false);
    if (pUVar2 == (UsdPreviewSurface *)0x0) {
      if (err != (string *)0x0) {
        pvVar1 = (shader->value).v_.vtable;
        if (pvVar1 == (vtable_type *)0x0) {
          local_98.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
          local_98._M_string_length = 4;
          local_98.field_2._M_allocated_capacity._4_4_ =
               local_98.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          (*pvVar1->type_name)(&local_98);
        }
        ::std::operator+(&local_40,"Unsupported shader type: ",&local_98);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_40);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_68 = *plVar5;
          lStack_60 = plVar4[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar5;
          local_78 = (long *)*plVar4;
        }
        local_70 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                   local_98.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
    }
    else {
      ::std::__cxx11::string::compare((char *)attr_name);
      paVar3 = tinyusdz::value::Value::as<std::array<unsigned_int,2ul>>((Value *)&local_58,false);
      if (paVar3 == (array<unsigned_int,_2UL> *)0x0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
      }
      else {
        *(undefined8 *)out_val->_M_elems = *(undefined8 *)paVar3->_M_elems;
      }
    }
    if (local_48 != (undefined **)0x0) {
      (*(code *)local_48[4])(&local_58);
    }
  }
  return false;
}

Assistant:

bool EvaluateShaderAttribute(
  const Stage &stage,
  const Shader &shader, const std::string &attr_name,
  T * out_val,
  std::string *err,
  const value::TimeCode timeCode) {

  if (!out_val) {
    return false;
  }

  uint32_t tyid = value::TypeTraits<T>::type_id();
  value::Value outval;

  bool result = false;

  if (const auto *psurf = shader.value.as<UsdPreviewSurface>()) {
    result = EvaluateUsdPreviewSurfaceAttribute(stage, *psurf, attr_name, tyid, outval, err, timeCode);
    if (const auto pt = outval.as<T>()) {
      (*out_val) = (*pt);
    } else {
      if (err) {
        (*err) += "[InternalError] Type mismatch.\n";
      }
      return false;
    }
  } else {
    if (err) {
      (*err) += "Unsupported shader type: " + shader.value.type_name() + "\n";
    }
    return false;
  }

  return result;
}